

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_playlist.cpp
# Opt level: O3

void __thiscall FPlayList::Shuffle(FPlayList *this)

{
  uint uVar1;
  long lVar2;
  FString *other;
  ulong uVar3;
  int iVar4;
  FString *other_00;
  FString FStack_38;
  
  uVar3 = (ulong)(this->Songs).Count;
  if (uVar3 != 0) {
    lVar2 = 0;
    iVar4 = 0;
    do {
      other = (FString *)((long)&((this->Songs).Array)->Chars + lVar2);
      uVar1 = rand();
      other_00 = (this->Songs).Array + (uint)((int)((ulong)uVar1 % (uVar3 & 0xffffffff)) + iVar4);
      FString::AttachToOther(&FStack_38,other);
      FString::operator=(other,other_00);
      FString::operator=(other_00,&FStack_38);
      FString::~FString(&FStack_38);
      iVar4 = iVar4 + 1;
      lVar2 = lVar2 + 8;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  this->Position = 0;
  return;
}

Assistant:

void FPlayList::Shuffle ()
{
	unsigned int numsongs = Songs.Size();
	unsigned int i;

	for (i = 0; i < numsongs; ++i)
	{
		swapvalues (Songs[i], Songs[(rand() % (numsongs - i)) + i]);
	}
	Position = 0;
}